

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O3

Abc_Cex_t * Abc_CexPermuteTwo(Abc_Cex_t *p,Vec_Int_t *vPermOld,Vec_Int_t *vPermNew)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  Vec_Int_t *vMapOld2New;
  int *__s;
  Abc_Cex_t *pAVar4;
  ulong uVar5;
  
  uVar1 = vPermOld->nSize;
  if (uVar1 != p->nPis) {
    __assert_fail("Vec_IntSize(vPermOld) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x208,"Abc_Cex_t *Abc_CexPermuteTwo(Abc_Cex_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (vPermNew->nSize != uVar1) {
    __assert_fail("Vec_IntSize(vPermNew) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x209,"Abc_Cex_t *Abc_CexPermuteTwo(Abc_Cex_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  vMapOld2New = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  vMapOld2New->nCap = uVar3;
  if (uVar3 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar3 << 2);
  }
  vMapOld2New->pArray = __s;
  vMapOld2New->nSize = uVar1;
  memset(__s,0xff,(long)(int)uVar1 << 2);
  if ((int)uVar1 < 1) {
    pAVar4 = Abc_CexPermute(p,vMapOld2New);
    if (__s == (int *)0x0) goto LAB_004133b0;
  }
  else {
    piVar2 = vPermOld->pArray;
    uVar5 = 0;
    do {
      if (uVar1 == uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (uVar1 <= (uint)piVar2[uVar5]) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[(uint)piVar2[uVar5]] = vPermNew->pArray[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    pAVar4 = Abc_CexPermute(p,vMapOld2New);
  }
  free(__s);
LAB_004133b0:
  free(vMapOld2New);
  return pAVar4;
}

Assistant:

Abc_Cex_t * Abc_CexPermuteTwo( Abc_Cex_t * p, Vec_Int_t * vPermOld, Vec_Int_t * vPermNew )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vPerm;
    int i, eOld, eNew;
    assert( Vec_IntSize(vPermOld) == p->nPis );
    assert( Vec_IntSize(vPermNew) == p->nPis );
    vPerm = Vec_IntStartFull( p->nPis );
    Vec_IntForEachEntryTwo( vPermOld, vPermNew, eOld, eNew, i )
        Vec_IntWriteEntry( vPerm, eOld, eNew );
    pCex = Abc_CexPermute( p, vPerm );
    Vec_IntFree( vPerm );
    return pCex;
}